

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void __thiscall
CMapLayers::LoadEnvPoints
          (CMapLayers *this,CLayers *pLayers,
          array<CEnvPoint,_allocator_default<CEnvPoint>_> *lEnvPoints)

{
  int iVar1;
  int iVar2;
  IMap *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CLayers *in_RSI;
  long in_FS_OFFSET;
  int c;
  CEnvPoint_v1 *pEnvPoint_v1;
  int i_1;
  int i;
  CMapItemEnvelope *pItem;
  int env;
  CEnvPoint *pPoints;
  int Num;
  int Start;
  int Num_1;
  int Start_1;
  CEnvPoint p;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  array<CEnvPoint,_allocator_default<CEnvPoint>_> *in_stack_ffffffffffffff50;
  int local_a8;
  int local_a4;
  int local_94;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  undefined4 local_60;
  undefined4 local_5c;
  int aiStack_58 [4];
  undefined4 auStack_48 [4];
  undefined4 auStack_38 [4];
  undefined4 auStack_28 [4];
  undefined4 auStack_18 [4];
  long local_8;
  int *piVar4;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(in_stack_ffffffffffffff50);
  pIVar3 = CLayers::Map(in_RSI);
  (*(pIVar3->super_IInterface)._vptr_IInterface[6])(pIVar3,6,&local_64,&local_68);
  if (local_68 != 0) {
    pIVar3 = CLayers::Map(in_RSI);
    iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[5])(pIVar3,(ulong)local_64,0);
    pIVar3 = CLayers::Map(in_RSI);
    (*(pIVar3->super_IInterface)._vptr_IInterface[6])(pIVar3,3,&local_6c,&local_70);
    if (local_70 != 0) {
      for (local_94 = 0; local_94 < local_70; local_94 = local_94 + 1) {
        pIVar3 = CLayers::Map(in_RSI);
        iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[5])
                          (pIVar3,(ulong)(uint)(local_6c + local_94),0);
        piVar4 = (int *)CONCAT44(extraout_var_00,iVar2);
        if (*piVar4 < 3) {
          for (local_a8 = 0; local_a8 < piVar4[3]; local_a8 = local_a8 + 1) {
            in_stack_ffffffffffffff50 =
                 (array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                 (CONCAT44(extraout_var,iVar1) + (long)(local_a8 + piVar4[2]) * 0x18);
            local_60 = *(undefined4 *)&in_stack_ffffffffffffff50->list;
            local_5c = *(undefined4 *)((long)&in_stack_ffffffffffffff50->list + 4);
            in_stack_ffffffffffffff48 = 0;
            while (in_stack_ffffffffffffff4c = in_stack_ffffffffffffff48,
                  iVar2 = minimum<int>(piVar4[1],4), in_stack_ffffffffffffff48 < iVar2) {
              aiStack_58[in_stack_ffffffffffffff4c] =
                   (&in_stack_ffffffffffffff50->list_size)[in_stack_ffffffffffffff4c];
              auStack_48[in_stack_ffffffffffffff4c] = 0;
              auStack_38[in_stack_ffffffffffffff4c] = 0;
              auStack_28[in_stack_ffffffffffffff4c] = 0;
              auStack_18[in_stack_ffffffffffffff4c] = 0;
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff4c + 1;
            }
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::add
                      (in_stack_ffffffffffffff50,
                       (CEnvPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          }
        }
        else {
          for (local_a4 = 0; local_a4 < piVar4[3]; local_a4 = local_a4 + 1) {
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::add
                      (in_stack_ffffffffffffff50,
                       (CEnvPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::LoadEnvPoints(const CLayers *pLayers, array<CEnvPoint>& lEnvPoints)
{
	lEnvPoints.clear();

	// get envelope points
	CEnvPoint *pPoints = 0x0;
	{
		int Start, Num;
		pLayers->Map()->GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);

		if(!Num)
			return;

		pPoints = (CEnvPoint *)pLayers->Map()->GetItem(Start, 0, 0);
	}

	// get envelopes
	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
	if(!Num)
		return;


	for(int env = 0; env < Num; env++)
	{
		CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+env, 0, 0);

		if(pItem->m_Version >= 3)
		{
			for(int i = 0; i < pItem->m_NumPoints; i++)
				lEnvPoints.add(pPoints[i + pItem->m_StartPoint]);
		}
		else
		{
			// backwards compatibility
			for(int i = 0; i < pItem->m_NumPoints; i++)
			{
				// convert CEnvPoint_v1 -> CEnvPoint
				CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pPoints)[i + pItem->m_StartPoint];
				CEnvPoint p;

				p.m_Time = pEnvPoint_v1->m_Time;
				p.m_Curvetype = pEnvPoint_v1->m_Curvetype;

				for(int c = 0; c < minimum(pItem->m_Channels, 4); c++)
				{
					p.m_aValues[c] = pEnvPoint_v1->m_aValues[c];
					p.m_aInTangentdx[c] = 0;
					p.m_aInTangentdy[c] = 0;
					p.m_aOutTangentdx[c] = 0;
					p.m_aOutTangentdy[c] = 0;
				}

				lEnvPoints.add(p);
			}
		}
	}
}